

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_posix.cpp
# Opt level: O2

void pstore::broker::gc_watch_thread::child_signal(int sig)

{
  undefined8 in_RAX;
  gc_watch_thread *pgVar1;
  int *piVar2;
  errno_saver old_errno;
  errno_saver local_14;
  
  local_14.old_ = (int)((ulong)in_RAX >> 0x20);
  errno_saver::errno_saver(&local_14);
  pgVar1 = getgc();
  LOCK();
  (pgVar1->cv_).signal_.super___atomic_base<int>._M_i = sig;
  UNLOCK();
  descriptor_condition_variable::notify_all_no_except(&(pgVar1->cv_).cv_);
  piVar2 = __errno_location();
  *piVar2 = local_14.old_;
  return;
}

Assistant:

void gc_watch_thread::child_signal (int const sig) {
            errno_saver const old_errno; //! OCLint(PH - meant to be unused)
            getgc ().cv_.notify_all (sig);
        }